

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

void release_current_frame(AV1Decoder *pbi)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)(pbi->common).buffer_pool;
  (((pbi->common).cur_frame)->buf).corrupted = 1;
  pthread_mutex_lock(__mutex);
  decrease_ref_count((pbi->common).cur_frame,(BufferPool *)&__mutex->__data);
  pthread_mutex_unlock(__mutex);
  (pbi->common).cur_frame = (RefCntBuffer *)0x0;
  return;
}

Assistant:

static void release_current_frame(AV1Decoder *pbi) {
  AV1_COMMON *const cm = &pbi->common;
  BufferPool *const pool = cm->buffer_pool;

  cm->cur_frame->buf.corrupted = 1;
  lock_buffer_pool(pool);
  decrease_ref_count(cm->cur_frame, pool);
  unlock_buffer_pool(pool);
  cm->cur_frame = NULL;
}